

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
::val(FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
      *this)

{
  long in_RSI;
  value_type *in_RDI;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
  *in_stack_ffffffffffffff88;
  value_type *this_00;
  Fad<double> *in_stack_ffffffffffffffc0;
  Fad<double> *in_stack_ffffffffffffffc8;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffffd8;
  Fad<double> *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
  ::val(in_stack_ffffffffffffff88);
  Fad<Fad<double>_>::val(*(Fad<Fad<double>_> **)(in_RSI + 8));
  operator/<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)this_00);
  Fad<double>::~Fad(this_00);
  return in_RDI;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}